

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O3

void __thiscall
TTD::SlabAllocatorBase<0>::SlabAllocatorBase(SlabAllocatorBase<0> *this,uint32 slabBlockSize)

{
  HeapAllocator *this_00;
  SlabBlock *pSVar1;
  undefined1 local_38 [8];
  TrackAllocData data;
  
  this->m_slabBlockSize = slabBlockSize;
  this->m_largeBlockList = (LargeSlabBlock *)0x0;
  data.plusSize = (size_t)slabBlockSize;
  local_38 = (undefined1  [8])&unsigned_char::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_3fb7b9b;
  data.filename._0_4_ = 0x267;
  this_00 = Memory::HeapAllocator::TrackAllocInfo
                      (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_38);
  pSVar1 = (SlabBlock *)Memory::HeapAllocator::AllocT<true>(this_00,(ulong)this->m_slabBlockSize);
  if (pSVar1 == (SlabBlock *)0x0) {
    TTDAbort_unrecoverable_error("OOM in TTD");
  }
  if (((ulong)pSVar1 & 3) == 0) {
    this->m_headBlock = pSVar1;
    this->m_currPos = (byte *)(pSVar1 + 1);
    this->m_endPos = (byte *)((long)&pSVar1->BlockData + (ulong)this->m_slabBlockSize);
    pSVar1->BlockData = (byte *)(pSVar1 + 1);
    pSVar1->Previous = (SlabBlock *)0x0;
    pSVar1->Next = (SlabBlock *)0x0;
    pSVar1->RefCounter = 0;
    this->m_reserveActiveBytes = 0;
    this->m_reserveActiveLargeBlock = (LargeSlabBlock *)0x0;
    this->m_totalAllocatedSize = 0;
    return;
  }
  TTDAbort_unrecoverable_error
            ("We have non-word aligned allocations so all our later work is not so useful");
}

Assistant:

SlabAllocatorBase(uint32 slabBlockSize)
            : m_largeBlockList(nullptr), m_slabBlockSize(slabBlockSize)
        {
            byte* allocBlock = TT_HEAP_ALLOC_ARRAY(byte, this->m_slabBlockSize);
            TTDAssert((reinterpret_cast<uint64>(allocBlock) & 0x3) == 0, "We have non-word aligned allocations so all our later work is not so useful");

            this->m_headBlock = (SlabBlock*)allocBlock;
            byte* dataArray = (allocBlock + TTD_SLAB_BLOCK_SIZE);

            this->m_currPos = dataArray;
            this->m_endPos = dataArray + TTD_SLAB_BLOCK_USABLE_SIZE(this->m_slabBlockSize);

            this->m_headBlock->BlockData = dataArray;

            this->m_headBlock->Next = nullptr;
            this->m_headBlock->Previous = nullptr;

            this->m_headBlock->RefCounter = 0;

#if ENABLE_TTD_INTERNAL_DIAGNOSTICS
            this->m_totalAllocatedSize = 0;
#endif

            this->m_reserveActiveBytes = 0;
            this->m_reserveActiveLargeBlock = nullptr;
        }